

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OgreStructs.cpp
# Opt level: O0

VertexData * __thiscall
Assimp::Ogre::Animation::AssociatedVertexData(Animation *this,VertexAnimationTrack *track)

{
  SubMesh *pSVar1;
  bool sharedGeom;
  VertexAnimationTrack *track_local;
  Animation *this_local;
  
  if (this->parentMesh == (Mesh *)0x0) {
    this_local = (Animation *)0x0;
  }
  else if (track->target == 0) {
    this_local = (Animation *)this->parentMesh->sharedVertexData;
  }
  else {
    pSVar1 = Ogre::Mesh::GetSubMesh(this->parentMesh,(long)(int)(track->target - 1));
    this_local = (Animation *)pSVar1->vertexData;
  }
  return (VertexData *)this_local;
}

Assistant:

VertexData *Animation::AssociatedVertexData(VertexAnimationTrack *track) const
{
    if (!parentMesh)
        return 0;

    bool sharedGeom = (track->target == 0);
    if (sharedGeom)
        return parentMesh->sharedVertexData;
    else
        return parentMesh->GetSubMesh(track->target-1)->vertexData;
}